

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O3

int jas_stream_display(jas_stream_t *stream,FILE *fp,int n)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ushort **ppuVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uchar buf [16];
  uint local_5c;
  byte abStack_48 [24];
  
  uVar4 = n + 0xf;
  if (-1 < n) {
    uVar4 = n;
  }
  if (0 < n) {
    uVar7 = 0;
    bVar2 = true;
    do {
      bVar3 = (int)(uVar4 & 0xfffffff0) <= (int)uVar7;
      if (uVar7 == 0) {
        bVar3 = bVar2;
      }
      if ((uint)n < 0x11) {
        bVar3 = bVar2;
      }
      if (bVar3) {
        fprintf((FILE *)fp,"%08x:",(ulong)uVar7);
        uVar5 = n - uVar7;
        local_5c = 0x10;
        if ((int)uVar5 < 0x10) {
          local_5c = uVar5;
        }
        if ((int)uVar5 < 1) {
          fputc(0x20,(FILE *)fp);
          bVar2 = false;
          uVar8 = 0;
LAB_00113d58:
          iVar9 = (int)uVar8 + -0x10;
          do {
            fwrite("   ",3,1,(FILE *)fp);
            iVar9 = iVar9 + 1;
          } while (iVar9 != 0);
        }
        else {
LAB_00113c98:
          uVar8 = 0;
          do {
            if ((stream->flags_ & 7U) != 0) {
LAB_00113df6:
              abort();
            }
            if ((-1 < stream->rwlimit_) && (stream->rwlimit_ <= stream->rwcnt_)) {
              stream->flags_ = stream->flags_ | 4;
              goto LAB_00113df6;
            }
            iVar9 = stream->cnt_;
            stream->cnt_ = iVar9 + -1;
            if (iVar9 < 1) {
              uVar5 = jas_stream_fillbuf(stream,1);
              if (uVar5 == 0xffffffff) goto LAB_00113df6;
            }
            else {
              stream->rwcnt_ = stream->rwcnt_ + 1;
              pbVar1 = stream->ptr_;
              stream->ptr_ = pbVar1 + 1;
              uVar5 = (uint)*pbVar1;
            }
            abStack_48[uVar8] = (byte)uVar5;
            uVar8 = uVar8 + 1;
          } while (uVar8 < local_5c);
          if (!bVar3) goto LAB_00113dd3;
          uVar8 = 0;
          do {
            uVar10 = uVar8;
            fprintf((FILE *)fp," %02x",(ulong)abStack_48[uVar10]);
            uVar8 = uVar10 + 1;
          } while (uVar8 < local_5c);
          fputc(0x20,(FILE *)fp);
          bVar2 = true;
          if (uVar10 < 0xf) {
            bVar2 = true;
            goto LAB_00113d58;
          }
        }
        if (bVar2) {
          ppuVar6 = __ctype_b_loc();
          uVar8 = 0;
          do {
            uVar5 = 0x20;
            if (((*ppuVar6)[abStack_48[uVar8]] >> 0xe & 1) != 0) {
              uVar5 = (uint)abStack_48[uVar8];
            }
            fputc(uVar5,(FILE *)fp);
            uVar8 = uVar8 + 1;
          } while (uVar8 < local_5c);
        }
        fputc(10,(FILE *)fp);
      }
      else {
        uVar5 = n - uVar7;
        local_5c = 0x10;
        if (uVar5 < 0x10) {
          local_5c = uVar5;
        }
        if (0 < (int)uVar5) goto LAB_00113c98;
      }
LAB_00113dd3:
      uVar7 = uVar7 + 0x10;
      bVar2 = bVar3;
    } while ((int)uVar7 < n);
  }
  return 0;
}

Assistant:

int jas_stream_display(jas_stream_t *stream, FILE *fp, int n)
{
	unsigned char buf[16];
	int i;
	int j;
	int m;
	int c;
	int display;
	int cnt;

	cnt = n - (n % 16);
	display = 1;

	for (i = 0; i < n; i += 16) {
		if (n > 16 && i > 0) {
			display = (i >= cnt) ? 1 : 0;
		}
		if (display) {
			fprintf(fp, "%08x:", i);
		}
		m = JAS_MIN(n - i, 16);
		for (j = 0; j < m; ++j) {
			if ((c = jas_stream_getc(stream)) == EOF) {
				abort();
				return -1;
			}
			buf[j] = c;
		}
		if (display) {
			for (j = 0; j < m; ++j) {
				fprintf(fp, " %02x", buf[j]);
			}
			fputc(' ', fp);
			for (; j < 16; ++j) {
				fprintf(fp, "   ");
			}
			for (j = 0; j < m; ++j) {
				if (isprint(buf[j])) {
					fputc(buf[j], fp);
				} else {
					fputc(' ', fp);
				}
			}
			fprintf(fp, "\n");
		}


	}
	return 0;
}